

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packer.h
# Opt level: O0

size_t __thiscall axl::sl::PackerSeq::append<axl::sl::Pack<unsigned_char>>(PackerSeq *this)

{
  size_t sVar1;
  PackerSeq *in_RDI;
  Packer *in_stack_ffffffffffffffe8;
  
  PackerImpl<axl::sl::Pack<unsigned_char>_>::getSingleton();
  sVar1 = append(in_RDI,in_stack_ffffffffffffffe8);
  return sVar1;
}

Assistant:

size_t
	append() {
		return append(PackerImpl<T>::getSingleton());
	}